

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O3

void no_label::print_no_label_update(vw *all,example *ec)

{
  shared_data *this;
  
  this = all->sd;
  if ((((double)this->dump_interval <=
        this->weighted_labeled_examples + this->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    shared_data::print_update
              (this,all->holdout_set_off,all->current_pass,0.0,(ec->pred).scalar,ec->num_features,
               all->progress_add,all->progress_arg);
    return;
  }
  return;
}

Assistant:

void print_no_label_update(vw& all, example& ec)
{
  if (all.sd->weighted_labeled_examples + all.sd->weighted_unlabeled_examples >= all.sd->dump_interval && !all.quiet &&
      !all.bfgs)
  {
    all.sd->print_update(all.holdout_set_off, all.current_pass, 0.f, ec.pred.scalar, ec.num_features, all.progress_add,
        all.progress_arg);
  }
}